

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteObservations.cpp
# Opt level: O1

string * __thiscall
MADPComponentDiscreteObservations::SoftPrint_abi_cxx11_
          (string *__return_storage_ptr__,MADPComponentDiscreteObservations *this)

{
  char cVar1;
  ostream *poVar2;
  stringstream ss;
  string local_1c8;
  stringstream local_1a8 [16];
  long local_198 [14];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"MADPComponentDiscreteObservations::Print()",0x2a);
  cVar1 = (char)(ostream *)local_198;
  std::ios::widen((char)*(undefined8 *)(local_198[0] + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"#joint observations=",0x14);
  GetNrJointObservations(this);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  SoftPrintObservationSets_abi_cxx11_(&local_1c8,this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"Joint Observations:",0x13);
  std::ios::widen((char)*(undefined8 *)(local_198[0] + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  SoftPrintJointObservationSet_abi_cxx11_(&local_1c8,this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

string MADPComponentDiscreteObservations::SoftPrint() const
{
    stringstream ss;
    ss << "MADPComponentDiscreteObservations::Print()" << endl;    
    ss << "#joint observations="<<GetNrJointObservations()<<endl;
    ss << SoftPrintObservationSets();
    ss << "Joint Observations:"<<endl;
    ss << SoftPrintJointObservationSet();    
    return(ss.str());
}